

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

qint64 QUtcTimeZonePrivate::offsetFromUtcString(QByteArrayView id)

{
  QByteArrayView s;
  bool bVar1;
  char cVar2;
  int iVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  unsigned_short field;
  TokenizerResult<const_QLatin1String_&,_QLatin1Char> *__range1;
  int prior;
  qint32 seconds;
  int sign;
  char signChar;
  bool ok;
  QLatin1String offset;
  sentinel __end1;
  iterator __begin1;
  QByteArrayView *in_stack_ffffffffffffff08;
  int base;
  undefined4 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff14;
  undefined2 in_stack_ffffffffffffff16;
  char (*in_stack_ffffffffffffff18) [4];
  QLatin1String *this;
  QByteArrayView *in_stack_ffffffffffffff20;
  storage_type *psVar6;
  QStringTokenizerBase<QLatin1String,_QChar> *this_00;
  undefined4 in_stack_ffffffffffffff30;
  int iVar7;
  undefined4 in_stack_ffffffffffffff34;
  int iVar8;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  long local_c0;
  undefined1 local_98 [63];
  char local_59;
  QByteArrayView local_38;
  QStringTokenizerBase<QLatin1String,_QChar> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArrayView::QByteArrayView<4ul>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  QVar5.m_size._4_4_ = in_stack_ffffffffffffff34;
  QVar5.m_size._0_4_ = in_stack_ffffffffffffff30;
  QVar5.m_data._0_4_ = in_stack_ffffffffffffff38;
  QVar5.m_data._4_4_ = in_stack_ffffffffffffff3c;
  bVar1 = QByteArrayView::startsWith(in_stack_ffffffffffffff08,QVar5);
  if ((bVar1) && (qVar4 = QByteArrayView::size(&local_38), 4 < qVar4)) {
    cVar2 = QByteArrayView::at((QByteArrayView *)
                               CONCAT26(in_stack_ffffffffffffff16,
                                        CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10
                                                )),(qsizetype)in_stack_ffffffffffffff08);
    if ((cVar2 == '-') || (cVar2 == '+')) {
      iVar3 = 1;
      if (cVar2 == '-') {
        iVar3 = -1;
      }
      iVar8 = 0;
      iVar7 = 0;
      psVar6 = &DAT_aaaaaaaaaaaaaaaa;
      QVar5 = QByteArrayView::mid((QByteArrayView *)&DAT_aaaaaaaaaaaaaaaa,
                                  CONCAT44(CONCAT13(cVar2,(int3)in_stack_ffffffffffffff3c),iVar3),0)
      ;
      this = (QLatin1String *)QVar5.m_size;
      s.m_data = psVar6;
      s.m_size = (qsizetype)QVar5.m_data;
      QLatin1String::QLatin1String(this,s);
      local_59 = (char)Qt::Literals::StringLiterals::operator____L1
                                 ((char)((ulong)in_stack_ffffffffffffff08 >> 0x30));
      QLatin1String::tokenize<QLatin1Char>
                ((QLatin1String *)
                 CONCAT26(in_stack_ffffffffffffff16,
                          CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                 (QLatin1Char *)in_stack_ffffffffffffff08);
      base = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      this_00 = &local_28;
      memset(local_98,0xaa,0x38);
      QStringTokenizerBase<QLatin1String,_QChar>::begin
                ((QStringTokenizerBase<QLatin1String,_QChar> *)
                 CONCAT26(in_stack_ffffffffffffff16,
                          CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)));
      QStringTokenizerBase<QLatin1String,_QChar>::end(this_00);
      bVar1 = ::operator!=(local_98);
      if (bVar1) {
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator*((iterator *)0x73c6db);
        QLatin1String::toUShort
                  (this,(bool *)CONCAT26(in_stack_ffffffffffffff16,
                                         CONCAT24(in_stack_ffffffffffffff14,
                                                  in_stack_ffffffffffffff10)),base);
        iVar3 = QTimeZonePrivate::invalidSeconds();
        local_c0 = (long)iVar3;
      }
      else if (iVar7 == 0) {
        iVar3 = QTimeZonePrivate::invalidSeconds();
        local_c0 = (long)iVar3;
      }
      else {
        while (iVar7 < 3) {
          iVar8 = iVar8 * 0x3c;
          iVar7 = iVar7 + 1;
        }
        local_c0 = (long)(iVar8 * iVar3);
      }
    }
    else {
      iVar3 = QTimeZonePrivate::invalidSeconds();
      local_c0 = (long)iVar3;
    }
  }
  else {
    iVar3 = QTimeZonePrivate::invalidSeconds();
    local_c0 = (long)iVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c0;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QUtcTimeZonePrivate::offsetFromUtcString(QByteArrayView id)
{
    // Convert reasonable UTC[+-]\d+(:\d+){,2} to offset in seconds.
    // Assumption: id has already been tried as a CLDR UTC offset ID (notably
    // including plain "UTC" itself) and a system offset ID; it's neither.
    if (!id.startsWith("UTC") || id.size() < 5)
        return invalidSeconds(); // Doesn't match
    const char signChar = id.at(3);
    if (signChar != '-' && signChar != '+')
        return invalidSeconds(); // No sign
    const int sign = signChar == '-' ? -1 : 1;

    qint32 seconds = 0;
    int prior = 0; // Number of fields parsed thus far
    for (auto offset : QLatin1StringView(id.mid(4)).tokenize(':'_L1)) {
        bool ok = false;
        unsigned short field = offset.toUShort(&ok);
        // Bound hour above at 24, minutes and seconds at 60:
        if (!ok || field >= (prior ? 60 : 24))
            return invalidSeconds();
        seconds = seconds * 60 + field;
        if (++prior > 3)
            return invalidSeconds(); // Too many numbers
    }

    if (!prior)
        return invalidSeconds(); // No numbers

    while (prior++ < 3)
        seconds *= 60;

    return seconds * sign;
}